

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O2

void __thiscall vox::DICT::Add(DICT *this,string *vKey,string *vValue)

{
  string local_a0;
  string local_80;
  DICTitem local_60;
  
  std::__cxx11::string::string((string *)&local_80,(string *)vKey);
  std::__cxx11::string::string((string *)&local_a0,(string *)vValue);
  DICTitem::DICTitem(&local_60,&local_80,&local_a0);
  std::vector<vox::DICTitem,_std::allocator<vox::DICTitem>_>::emplace_back<vox::DICTitem>
            (&this->keys,&local_60);
  DICTitem::~DICTitem(&local_60);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void DICT::Add(std::string vKey, std::string vValue) { keys.push_back(DICTitem(vKey, vValue)); }